

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.c
# Opt level: O1

bool_t prf_texture_save_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  uint8_t *buffer;
  uint uVar1;
  uint len;
  bool_t bVar2;
  
  if (node->opcode == prf_texture_info.opcode) {
    bf_put_uint16_be(bfile,node->opcode);
    bf_put_uint16_be(bfile,node->length);
    uVar1 = 4;
    if (0xcb < node->length) {
      buffer = node->data;
      bf_write(bfile,buffer,200);
      uVar1 = 0xcc;
      if (0xcf < node->length) {
        bf_put_int32_be(bfile,*(int32_t *)(buffer + 200));
        uVar1 = 0xd0;
        if (0xd3 < node->length) {
          bf_put_int32_be(bfile,*(int32_t *)(buffer + 0xcc));
          uVar1 = 0xd4;
          if (0xd7 < node->length) {
            bf_put_int32_be(bfile,*(int32_t *)(buffer + 0xd0));
            uVar1 = 0xd8;
          }
        }
      }
    }
    bVar2 = 1;
    len = node->length - uVar1;
    if (uVar1 <= node->length && len != 0) {
      bf_write(bfile,node->data + ((ulong)uVar1 - 4),len);
    }
  }
  else {
    bVar2 = 0;
    prf_error(9,"tried using texture save method for node of type %d.");
  }
  return bVar2;
}

Assistant:

static
bool_t
prf_texture_save_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos;

    assert( node != NULL && state != NULL && bfile != NULL );

    if ( node->opcode != prf_texture_info.opcode ) {
        prf_error( 9, "tried using texture save method for node of type %d.",
                   node->opcode);
        return FALSE;
    }
    
    bf_put_uint16_be( bfile, node->opcode );
    bf_put_uint16_be( bfile, node->length );

    pos = 4;
    do {
        node_data * data;
        data = (node_data *) node->data;

        if ( node->length < (pos + 200) ) break;
        bf_write( bfile, (unsigned char *) data->filename, 200 ); pos += 200;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->pattern_index ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->x_location ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->y_location ); pos += 4;
    } while ( FALSE );

    if ( node->length > pos )
        pos += bf_write( bfile, node->data + pos - 4 + NODE_DATA_PAD,
                         node->length - pos);
  
    return TRUE;
}